

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O3

size_t ZSTD_compressBlock_btlazy2
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  int iVar3;
  size_t sVar4;
  ulong *puVar5;
  size_t sVar6;
  size_t sVar7;
  uint uVar8;
  U32 UVar9;
  ulong *puVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  int *piVar14;
  BYTE *pBVar15;
  int *piVar16;
  BYTE *pBVar17;
  seqDef *psVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  BYTE *pInLoopLimit;
  BYTE *ip;
  bool bVar23;
  size_t offsetFound;
  uint local_a4;
  size_t local_a0;
  int *local_98;
  ulong *local_90;
  uint local_84;
  int *local_80;
  ulong *local_78;
  ulong *local_70;
  long local_68;
  ZSTD_matchState_t *local_60;
  uint local_54;
  uint local_50;
  uint local_4c;
  seqStore_t *local_48;
  uint *local_40;
  BYTE *local_38;
  
  local_90 = (ulong *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  local_38 = (ms->window).base + (ms->window).dictLimit;
  local_4c = rep[1];
  piVar16 = (int *)((ulong)((int)src == (int)local_38) + (long)src);
  local_50 = (int)piVar16 - (int)local_38;
  uVar21 = (ulong)local_4c;
  if (local_50 < local_4c) {
    uVar21 = 0;
  }
  uVar13 = (uint)uVar21;
  local_54 = *rep;
  ms->nextToUpdate3 = ms->nextToUpdate;
  local_a4 = local_54;
  if (local_50 < local_54) {
    local_a4 = 0;
  }
  if (piVar16 < local_80) {
    puVar1 = (ulong *)((long)local_90 - 7);
    local_70 = (ulong *)((long)local_90 + -3);
    local_78 = (ulong *)((long)local_90 + -1);
    local_60 = ms;
    local_48 = seqStore;
    local_40 = rep;
    do {
      local_98 = (int *)((long)piVar16 + 1);
      local_68 = -(ulong)local_a4;
      local_84 = (uint)uVar21;
      if (local_a4 == 0) {
        uVar21 = 0;
      }
      else {
        uVar21 = 0;
        if (*(int *)((long)local_98 - (ulong)local_a4) == *(int *)((long)piVar16 + 1)) {
          puVar2 = (ulong *)((long)piVar16 + 5);
          puVar10 = (ulong *)((long)piVar16 + local_68 + 5);
          puVar5 = puVar2;
          if (puVar2 < puVar1) {
            if (*puVar10 == *puVar2) {
              lVar12 = 0;
              do {
                puVar5 = (ulong *)((long)piVar16 + lVar12 + 0xd);
                if (puVar1 <= puVar5) {
                  puVar10 = (ulong *)((long)piVar16 + local_68 + lVar12 + 0xd);
                  puVar5 = (ulong *)((long)piVar16 + lVar12 + 0xd);
                  goto LAB_00482703;
                }
                uVar21 = *(ulong *)((long)piVar16 + lVar12 + local_68 + 0xd);
                uVar20 = *puVar5;
                lVar12 = lVar12 + 8;
              } while (uVar21 == uVar20);
              uVar20 = uVar20 ^ uVar21;
              uVar21 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar12;
            }
            else {
              uVar20 = *puVar2 ^ *puVar10;
              uVar21 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_00482703:
            if ((puVar5 < local_70) && ((int)*puVar10 == (int)*puVar5)) {
              puVar5 = (ulong *)((long)puVar5 + 4);
              puVar10 = (ulong *)((long)puVar10 + 4);
            }
            if ((puVar5 < local_78) && ((short)*puVar10 == (short)*puVar5)) {
              puVar5 = (ulong *)((long)puVar5 + 2);
              puVar10 = (ulong *)((long)puVar10 + 2);
            }
            if (puVar5 < local_90) {
              puVar5 = (ulong *)((long)puVar5 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar5));
            }
            uVar21 = (long)puVar5 - (long)puVar2;
          }
          uVar21 = uVar21 + 4;
        }
      }
      local_a0 = 999999999;
      sVar4 = ZSTD_BtFindBestMatch_selectMLS(local_60,(BYTE *)piVar16,(BYTE *)local_90,&local_a0);
      sVar7 = uVar21;
      if (uVar21 < sVar4) {
        sVar7 = sVar4;
      }
      if (sVar7 < 4) {
        piVar16 = (int *)((long)piVar16 + ((long)piVar16 - (long)src >> 8) + 1);
        uVar21 = (ulong)local_84;
      }
      else {
        piVar14 = piVar16;
        if (sVar4 <= uVar21) {
          local_a0 = 0;
          piVar14 = local_98;
        }
        bVar23 = piVar16 < local_80;
        local_98 = piVar14;
        sVar4 = local_a0;
        while (bVar23) {
          piVar14 = (int *)((long)piVar16 + 1);
          if (sVar4 == 0) {
            sVar4 = 0;
          }
          else if ((local_a4 != 0) && (*piVar14 == *(int *)((long)piVar14 + local_68))) {
            puVar2 = (ulong *)((long)piVar16 + 5);
            puVar10 = (ulong *)((long)piVar16 + local_68 + 5);
            puVar5 = puVar2;
            if (puVar2 < puVar1) {
              if (*puVar10 == *puVar2) {
                puVar5 = (ulong *)((long)piVar16 + 0xd);
                do {
                  if (puVar1 <= puVar5) {
                    puVar10 = (ulong *)((long)puVar5 + local_68);
                    goto LAB_0048285b;
                  }
                  puVar10 = (ulong *)((long)puVar5 + local_68);
                  uVar21 = *puVar5;
                  puVar5 = puVar5 + 1;
                } while (*puVar10 == uVar21);
                uVar21 = uVar21 ^ *puVar10;
                uVar20 = 0;
                if (uVar21 != 0) {
                  for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                  }
                }
                puVar5 = (ulong *)((long)puVar5 + ((uVar20 >> 3 & 0x1fffffff) - 8));
                goto LAB_00482899;
              }
              uVar20 = *puVar2 ^ *puVar10;
              uVar21 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                }
              }
              uVar21 = uVar21 >> 3 & 0x1fffffff;
            }
            else {
LAB_0048285b:
              if ((puVar5 < local_70) && ((int)*puVar10 == (int)*puVar5)) {
                puVar5 = (ulong *)((long)puVar5 + 4);
                puVar10 = (ulong *)((long)puVar10 + 4);
              }
              if ((puVar5 < local_78) && ((short)*puVar10 == (short)*puVar5)) {
                puVar5 = (ulong *)((long)puVar5 + 2);
                puVar10 = (ulong *)((long)puVar10 + 2);
              }
              if (puVar5 < local_90) {
                puVar5 = (ulong *)((long)puVar5 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar5));
              }
LAB_00482899:
              uVar21 = (long)puVar5 - (long)puVar2;
              if (0xfffffffffffffffb < uVar21) goto LAB_004828cb;
            }
            uVar8 = (int)sVar4 + 1;
            uVar13 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            if ((int)((uVar13 ^ 0x1f) + (int)sVar7 * 3 + -0x1e) < (int)(uVar21 + 4) * 3) {
              sVar4 = 0;
              sVar7 = uVar21 + 4;
              local_98 = piVar14;
            }
          }
LAB_004828cb:
          local_a0 = 999999999;
          sVar6 = ZSTD_BtFindBestMatch_selectMLS
                            (local_60,(BYTE *)piVar14,(BYTE *)local_90,&local_a0);
          if (sVar6 < 4) {
LAB_0048291c:
            if (local_80 <= piVar14) break;
            piVar14 = (int *)((long)piVar16 + 2);
            if (sVar4 == 0) {
              sVar4 = 0;
            }
            else if ((local_a4 != 0) && (*piVar14 == *(int *)((long)piVar14 + local_68))) {
              puVar2 = (ulong *)((long)piVar16 + 6);
              puVar5 = (ulong *)((long)piVar16 + local_68 + 6);
              puVar10 = puVar2;
              if (puVar2 < puVar1) {
                if (*puVar5 == *puVar2) {
                  puVar10 = (ulong *)((long)piVar16 + 0xe);
                  do {
                    if (puVar1 <= puVar10) {
                      puVar5 = (ulong *)(local_68 + (long)puVar10);
                      goto LAB_004829b7;
                    }
                    puVar5 = (ulong *)((long)puVar10 + local_68);
                    uVar21 = *puVar10;
                    puVar10 = puVar10 + 1;
                  } while (*puVar5 == uVar21);
                  uVar21 = uVar21 ^ *puVar5;
                  uVar20 = 0;
                  if (uVar21 != 0) {
                    for (; (uVar21 >> uVar20 & 1) == 0; uVar20 = uVar20 + 1) {
                    }
                  }
                  puVar10 = (ulong *)((long)puVar10 + ((uVar20 >> 3 & 0x1fffffff) - 8));
                  goto LAB_004829f8;
                }
                uVar20 = *puVar2 ^ *puVar5;
                uVar21 = 0;
                if (uVar20 != 0) {
                  for (; (uVar20 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                uVar21 = uVar21 >> 3 & 0x1fffffff;
              }
              else {
LAB_004829b7:
                if ((puVar10 < local_70) && ((int)*puVar5 == (int)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 4);
                  puVar5 = (ulong *)((long)puVar5 + 4);
                }
                if ((puVar10 < local_78) && ((short)*puVar5 == (short)*puVar10)) {
                  puVar10 = (ulong *)((long)puVar10 + 2);
                  puVar5 = (ulong *)((long)puVar5 + 2);
                }
                if (puVar10 < local_90) {
                  puVar10 = (ulong *)((long)puVar10 + (ulong)((BYTE)*puVar5 == (BYTE)*puVar10));
                }
LAB_004829f8:
                uVar21 = (long)puVar10 - (long)puVar2;
                if (0xfffffffffffffffb < uVar21) goto LAB_00482a2c;
              }
              uVar8 = (int)sVar4 + 1;
              uVar13 = 0x1f;
              if (uVar8 != 0) {
                for (; uVar8 >> uVar13 == 0; uVar13 = uVar13 - 1) {
                }
              }
              if ((int)((uVar13 ^ 0x1f) + (int)sVar7 * 4 + -0x1e) < (int)(uVar21 + 4) * 4) {
                sVar4 = 0;
                sVar7 = uVar21 + 4;
                local_98 = piVar14;
              }
            }
LAB_00482a2c:
            local_a0 = 999999999;
            sVar6 = ZSTD_BtFindBestMatch_selectMLS
                              (local_60,(BYTE *)piVar14,(BYTE *)local_90,&local_a0);
            if (sVar6 < 4) break;
            uVar8 = (int)sVar4 + 1;
            uVar13 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            uVar8 = (int)local_a0 + 1;
            iVar3 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
              }
            }
            if ((int)sVar6 * 4 - iVar3 <= (int)((uVar13 ^ 0x1f) + (int)sVar7 * 4 + -0x18)) break;
          }
          else {
            uVar8 = (int)sVar4 + 1;
            uVar13 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> uVar13 == 0; uVar13 = uVar13 - 1) {
              }
            }
            uVar8 = (int)local_a0 + 1;
            iVar3 = 0x1f;
            if (uVar8 != 0) {
              for (; uVar8 >> iVar3 == 0; iVar3 = iVar3 + -1) {
              }
            }
            if ((int)sVar6 * 4 - iVar3 <= (int)((uVar13 ^ 0x1f) + (int)sVar7 * 4 + -0x1b))
            goto LAB_0048291c;
          }
          bVar23 = piVar14 < local_80;
          local_98 = piVar14;
          piVar16 = piVar14;
          sVar4 = local_a0;
          sVar7 = sVar6;
        }
        if (sVar4 == 0) {
          UVar9 = 1;
        }
        else {
          if ((src < local_98) && (local_38 < (BYTE *)((long)local_98 + (2 - sVar4)))) {
            piVar16 = local_98;
            while (local_98 = piVar16,
                  *(BYTE *)((long)piVar16 + -1) == *(BYTE *)((long)piVar16 + (1 - sVar4))) {
              local_98 = (int *)((long)piVar16 + -1);
              sVar7 = sVar7 + 1;
              if ((local_98 <= src) ||
                 (pBVar15 = (BYTE *)((long)piVar16 + (1 - sVar4)), piVar16 = local_98,
                 pBVar15 <= local_38)) break;
            }
          }
          local_84 = local_a4;
          local_a4 = (int)sVar4 - 2;
          UVar9 = (int)sVar4 + 1;
        }
        uVar21 = (long)local_98 - (long)src;
        pBVar17 = local_48->lit;
        pBVar15 = pBVar17 + uVar21;
        do {
          *(undefined8 *)pBVar17 = *src;
          pBVar17 = pBVar17 + 8;
          src = (void *)((long)src + 8);
        } while (pBVar17 < pBVar15);
        local_48->lit = local_48->lit + uVar21;
        if (uVar21 < 0x10000) {
          psVar18 = local_48->sequences;
        }
        else {
          local_48->longLengthID = 1;
          psVar18 = local_48->sequences;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)local_48->sequencesStart) >> 3);
        }
        psVar18->litLength = (U16)uVar21;
        psVar18->offset = UVar9;
        if (0xffff < sVar7 - 3) {
          local_48->longLengthID = 2;
          local_48->longLengthPos =
               (U32)((ulong)((long)psVar18 - (long)local_48->sequencesStart) >> 3);
        }
        psVar18->matchLength = (U16)(sVar7 - 3);
        local_48->sequences = psVar18 + 1;
        piVar16 = (int *)((long)local_98 + sVar7);
        uVar21 = (ulong)local_84;
        src = piVar16;
        if ((local_84 != 0) && (piVar16 <= local_80)) {
          uVar20 = (ulong)local_a4;
          while( true ) {
            uVar11 = uVar20;
            uVar20 = uVar21;
            uVar21 = uVar20;
            src = piVar16;
            local_a4 = (uint)uVar11;
            if (*piVar16 != *(int *)((long)piVar16 - uVar20)) break;
            lVar12 = -uVar20;
            puVar2 = (ulong *)(piVar16 + 1);
            puVar10 = (ulong *)((long)piVar16 + lVar12 + 4);
            puVar5 = puVar2;
            if (puVar2 < puVar1) {
              if (*puVar10 == *puVar2) {
                lVar19 = 0;
                do {
                  puVar5 = (ulong *)((long)piVar16 + lVar19 + 0xc);
                  if (puVar1 <= puVar5) {
                    puVar10 = (ulong *)((long)piVar16 + lVar12 + lVar19 + 0xc);
                    puVar5 = (ulong *)((long)piVar16 + lVar19 + 0xc);
                    goto LAB_00482c48;
                  }
                  uVar21 = *(ulong *)((long)piVar16 + lVar19 + lVar12 + 0xc);
                  uVar22 = *puVar5;
                  lVar19 = lVar19 + 8;
                } while (uVar21 == uVar22);
                uVar22 = uVar22 ^ uVar21;
                uVar21 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                uVar21 = (uVar21 >> 3 & 0x1fffffff) + lVar19;
              }
              else {
                uVar22 = *puVar2 ^ *puVar10;
                uVar21 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
                  }
                }
                uVar21 = uVar21 >> 3 & 0x1fffffff;
              }
            }
            else {
LAB_00482c48:
              if ((puVar5 < local_70) && ((int)*puVar10 == (int)*puVar5)) {
                puVar5 = (ulong *)((long)puVar5 + 4);
                puVar10 = (ulong *)((long)puVar10 + 4);
              }
              if ((puVar5 < local_78) && ((short)*puVar10 == (short)*puVar5)) {
                puVar5 = (ulong *)((long)puVar5 + 2);
                puVar10 = (ulong *)((long)puVar10 + 2);
              }
              if (puVar5 < local_90) {
                puVar5 = (ulong *)((long)puVar5 + (ulong)((BYTE)*puVar10 == (BYTE)*puVar5));
              }
              uVar21 = (long)puVar5 - (long)puVar2;
            }
            *(undefined8 *)local_48->lit = *(undefined8 *)piVar16;
            psVar18 = local_48->sequences;
            psVar18->litLength = 0;
            psVar18->offset = 1;
            if (0xffff < uVar21 + 1) {
              local_48->longLengthID = 2;
              local_48->longLengthPos =
                   (U32)((ulong)((long)psVar18 - (long)local_48->sequencesStart) >> 3);
            }
            psVar18->matchLength = (U16)(uVar21 + 1);
            local_48->sequences = psVar18 + 1;
            piVar16 = (int *)((long)piVar16 + uVar21 + 4);
            uVar21 = uVar11;
            src = piVar16;
            local_a4 = (uint)uVar20;
            if (((uint)uVar11 == 0) || (local_80 < piVar16)) break;
          }
        }
      }
    } while (piVar16 < local_80);
    uVar13 = (uint)uVar21;
    rep = local_40;
  }
  uVar8 = 0;
  if (local_50 < local_4c) {
    uVar8 = local_4c;
  }
  if (local_50 < local_54) {
    uVar8 = local_54;
  }
  if (local_a4 == 0) {
    local_a4 = uVar8;
  }
  if (uVar13 != 0) {
    uVar8 = uVar13;
  }
  *rep = local_a4;
  rep[1] = uVar8;
  return (long)local_90 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 1, 2, ZSTD_noDict);
}